

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

void __thiscall CompareTest_LongVarint_Test::TestBody(CompareTest_LongVarint_Test *this)

{
  initializer_list<UnknownField> __l;
  initializer_list<UnknownField> __l_00;
  initializer_list<UnknownField> __l_01;
  initializer_list<UnknownField> __l_02;
  bool bVar1;
  char *pcVar2;
  UnknownField *local_430;
  UnknownField *local_418;
  UnknownField *local_368;
  UnknownField *local_350;
  AssertHelper local_310;
  Message local_308;
  allocator<UnknownField> local_2f9;
  Varint local_2f8;
  Varint local_2f0;
  undefined4 *local_2e8;
  undefined1 local_2e0 [48];
  undefined4 local_2b0 [2];
  variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> local_2a8 [40];
  iterator local_280;
  undefined1 local_278 [39];
  allocator<UnknownField> local_251;
  LongVarint local_250;
  LongVarint local_248;
  undefined4 *local_240;
  undefined1 local_238 [48];
  undefined4 local_208 [2];
  variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> local_200 [40];
  iterator local_1d8;
  undefined1 local_1d0 [32];
  upb_UnknownCompareResult local_1b0 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  Message local_190;
  allocator<UnknownField> local_181;
  Varint local_180;
  Varint local_178;
  undefined4 *local_170;
  undefined1 local_168 [48];
  undefined4 local_138 [2];
  variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> local_130 [40];
  iterator local_108;
  undefined1 local_100 [39];
  allocator<UnknownField> local_d9;
  LongVarint local_d8 [3];
  LongVarint local_c0;
  undefined4 *local_b8;
  undefined1 local_b0 [48];
  undefined4 local_80 [2];
  variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> local_78 [40];
  iterator local_50;
  undefined1 local_48 [32];
  upb_UnknownCompareResult local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CompareTest_LongVarint_Test *this_local;
  
  local_28[1] = 0;
  local_b8 = (undefined4 *)local_b0;
  local_b0._0_4_ = 1;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  LongVarint::LongVarint(&local_c0,0x7b);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<LongVarint,void,void,LongVarint,void>
            ((variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> *)(local_b0 + 8),&local_c0)
  ;
  local_b8 = local_80;
  local_80[0] = 2;
  LongVarint::LongVarint(local_d8,0x1c8);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<LongVarint,void,void,LongVarint,void>(local_78,local_d8);
  local_50 = (iterator)local_b0;
  local_48._0_8_ = (Varint)0x2;
  std::allocator<UnknownField>::allocator(&local_d9);
  __l_02._M_len = local_48._0_8_;
  __l_02._M_array = local_50;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_48 + 8),__l_02,&local_d9)
  ;
  local_170 = (undefined4 *)local_168;
  local_168._0_4_ = 1;
  Varint::Varint(&local_178,0x7b);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<Varint,void,void,Varint,void>
            ((variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> *)(local_168 + 8),
             &local_178);
  local_170 = local_138;
  local_138[0] = 2;
  Varint::Varint(&local_180,0x1c8);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<Varint,void,void,Varint,void>(local_130,&local_180);
  local_108 = (iterator)local_168;
  local_100._0_8_ = (Varint)0x2;
  std::allocator<UnknownField>::allocator(&local_181);
  __l_01._M_len = local_100._0_8_;
  __l_01._M_array = local_108;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_100 + 8),__l_01,
             &local_181);
  local_28[0] = CompareUnknown((UnknownFields *)(local_48 + 8),(UnknownFields *)(local_100 + 8));
  testing::internal::EqHelper::Compare<upb_UnknownCompareResult,_upb_UnknownCompareResult,_nullptr>
            ((EqHelper *)local_20,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,local_28 + 1,local_28);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_100 + 8));
  std::allocator<UnknownField>::~allocator(&local_181);
  local_350 = (UnknownField *)&local_108;
  do {
    local_350 = local_350 + -1;
    UnknownField::~UnknownField(local_350);
  } while (local_350 != (UnknownField *)local_168);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_48 + 8));
  std::allocator<UnknownField>::~allocator(&local_d9);
  local_368 = (UnknownField *)&local_50;
  do {
    local_368 = local_368 + -1;
    UnknownField::~UnknownField(local_368);
  } while (local_368 != (UnknownField *)local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_1b0[1] = 0;
  local_240 = (undefined4 *)local_238;
  local_238._0_4_ = 2;
  LongVarint::LongVarint(&local_248,0x1c8);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<LongVarint,void,void,LongVarint,void>
            ((variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> *)(local_238 + 8),
             &local_248);
  local_240 = local_208;
  local_208[0] = 1;
  LongVarint::LongVarint(&local_250,0x7b);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<LongVarint,void,void,LongVarint,void>(local_200,&local_250);
  local_1d8 = (iterator)local_238;
  local_1d0._0_8_ = (Varint)0x2;
  std::allocator<UnknownField>::allocator(&local_251);
  __l_00._M_len = local_1d0._0_8_;
  __l_00._M_array = local_1d8;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_1d0 + 8),__l_00,
             &local_251);
  local_2e8 = (undefined4 *)local_2e0;
  local_2e0._0_4_ = 1;
  Varint::Varint(&local_2f0,0x7b);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<Varint,void,void,Varint,void>
            ((variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group> *)(local_2e0 + 8),
             &local_2f0);
  local_2e8 = local_2b0;
  local_2b0[0] = 2;
  Varint::Varint(&local_2f8,0x1c8);
  std::variant<Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>::
  variant<Varint,void,void,Varint,void>(local_2a8,&local_2f8);
  local_280 = (iterator)local_2e0;
  local_278._0_8_ = (Varint)0x2;
  std::allocator<UnknownField>::allocator(&local_2f9);
  __l._M_len = local_278._0_8_;
  __l._M_array = local_280;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_278 + 8),__l,&local_2f9);
  local_1b0[0] = CompareUnknown((UnknownFields *)(local_1d0 + 8),(UnknownFields *)(local_278 + 8));
  testing::internal::EqHelper::Compare<upb_UnknownCompareResult,_upb_UnknownCompareResult,_nullptr>
            ((EqHelper *)local_1a8,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,local_1b0 + 1,local_1b0);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_278 + 8));
  std::allocator<UnknownField>::~allocator(&local_2f9);
  local_418 = (UnknownField *)&local_280;
  do {
    local_418 = local_418 + -1;
    UnknownField::~UnknownField(local_418);
  } while (local_418 != (UnknownField *)local_2e0);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector
            ((vector<UnknownField,_std::allocator<UnknownField>_> *)(local_1d0 + 8));
  std::allocator<UnknownField>::~allocator(&local_251);
  local_430 = (UnknownField *)&local_1d8;
  do {
    local_430 = local_430 + -1;
    UnknownField::~UnknownField(local_430);
  } while (local_430 != (UnknownField *)local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  return;
}

Assistant:

TEST(CompareTest, LongVarint) {
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
}